

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall
helics::Publication::Publication
          (Publication *this,ValueFederate *valueFed,InterfaceHandle id,string_view key,
          string_view type,string_view units)

{
  element_type *peVar1;
  DataType DVar2;
  uint64_t match_flags;
  char *extraout_RDX;
  shared_ptr<units::precise_unit> *this_00;
  Federate *federate;
  string_view typeName;
  undefined1 auStack_58 [16];
  string local_48;
  precise_unit local_28;
  
  if (valueFed == (ValueFederate *)0x0) {
    federate = (Federate *)0x0;
  }
  else {
    federate = (Federate *)
               ((long)&valueFed->_vptr_ValueFederate + (long)valueFed->_vptr_ValueFederate[-3]);
  }
  Interface::Interface(&this->super_Interface,federate,id,key);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Publication_00447218;
  this->fed = valueFed;
  this->referenceIndex = -1;
  this->dataReference = (void *)0x0;
  this->delta = -1.0;
  this->pubType = HELICS_ANY;
  this->changeDetectionEnabled = false;
  this->disableAssign = false;
  *(__index_type *)
   ((long)&(this->prevValue).
           super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           .
           super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
   + 0x28) = '\0';
  this->customTypeHash = 0;
  *(undefined8 *)
   &(this->prevValue).
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    .
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = 0;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->pubUnits,(basic_string_view<char,_std::char_traits<char>_> *)&units,
             (allocator<char> *)auStack_58);
  (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  typeName._M_str = extraout_RDX;
  typeName._M_len = (size_t)type._M_str;
  DVar2 = getTypeFromString((helics *)type._M_len,typeName);
  this->pubType = DVar2;
  if (units._M_len != 0) {
    std::__cxx11::string::string
              ((string *)&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->pubUnits)
    ;
    match_flags = ::units::getDefaultFlags();
    local_28 = ::units::unit_from_string(&local_48,match_flags);
    std::make_shared<units::precise_unit,units::precise_unit>((precise_unit *)auStack_58);
    this_00 = &this->pubUnitType;
    std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
    std::__cxx11::string::~string((string *)&local_48);
    peVar1 = (this_00->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((NAN(peVar1->multiplier_)) && (peVar1->base_units_ == (unit_data)0xfa94a488)) {
      std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::reset
                (&this_00->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return;
}

Assistant:

Publication::Publication(ValueFederate* valueFed,
                         InterfaceHandle id,
                         std::string_view key,
                         std::string_view type,
                         std::string_view units):
    Interface(valueFed, id, key), fed(valueFed), pubUnits(units)
{
    pubType = getTypeFromString(type);
    if (!units.empty()) {
        pubUnitType = std::make_shared<units::precise_unit>(units::unit_from_string(pubUnits));
        if (!units::is_valid(*pubUnitType)) {
            pubUnitType.reset();
        }
    }
}